

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int mbedtls_rsa_copy(mbedtls_rsa_context *dst,mbedtls_rsa_context *src)

{
  int iVar1;
  
  dst->ver = src->ver;
  dst->len = src->len;
  iVar1 = mbedtls_mpi_copy(&dst->N,&src->N);
  if (((((iVar1 == 0) && (iVar1 = mbedtls_mpi_copy(&dst->E,&src->E), iVar1 == 0)) &&
       (iVar1 = mbedtls_mpi_copy(&dst->D,&src->D), iVar1 == 0)) &&
      (((iVar1 = mbedtls_mpi_copy(&dst->P,&src->P), iVar1 == 0 &&
        (iVar1 = mbedtls_mpi_copy(&dst->Q,&src->Q), iVar1 == 0)) &&
       ((iVar1 = mbedtls_mpi_copy(&dst->DP,&src->DP), iVar1 == 0 &&
        ((iVar1 = mbedtls_mpi_copy(&dst->DQ,&src->DQ), iVar1 == 0 &&
         (iVar1 = mbedtls_mpi_copy(&dst->QP,&src->QP), iVar1 == 0)))))))) &&
     ((iVar1 = mbedtls_mpi_copy(&dst->RP,&src->RP), iVar1 == 0 &&
      ((((iVar1 = mbedtls_mpi_copy(&dst->RQ,&src->RQ), iVar1 == 0 &&
         (iVar1 = mbedtls_mpi_copy(&dst->RN,&src->RN), iVar1 == 0)) &&
        (iVar1 = mbedtls_mpi_copy(&dst->Vi,&src->Vi), iVar1 == 0)) &&
       (iVar1 = mbedtls_mpi_copy(&dst->Vf,&src->Vf), iVar1 == 0)))))) {
    iVar1 = src->hash_id;
    dst->padding = src->padding;
    dst->hash_id = iVar1;
    return 0;
  }
  mbedtls_rsa_free(dst);
  return iVar1;
}

Assistant:

int mbedtls_rsa_copy( mbedtls_rsa_context *dst, const mbedtls_rsa_context *src )
{
    int ret;

    dst->ver = src->ver;
    dst->len = src->len;

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->N, &src->N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->E, &src->E ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->D, &src->D ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->P, &src->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Q, &src->Q ) );

#if !defined(MBEDTLS_RSA_NO_CRT)
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->DP, &src->DP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->DQ, &src->DQ ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->QP, &src->QP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RP, &src->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RQ, &src->RQ ) );
#endif

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RN, &src->RN ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Vi, &src->Vi ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Vf, &src->Vf ) );

    dst->padding = src->padding;
    dst->hash_id = src->hash_id;

cleanup:
    if( ret != 0 )
        mbedtls_rsa_free( dst );

    return( ret );
}